

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<FUDMFKey,_FUDMFKey>::DoCopy
          (TArray<FUDMFKey,_FUDMFKey> *this,TArray<FUDMFKey,_FUDMFKey> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  FUDMFKey *pFVar4;
  undefined8 uVar5;
  FUDMFKey *pFVar6;
  ulong uVar7;
  long lVar8;
  
  uVar3 = other->Count;
  this->Count = uVar3;
  this->Most = uVar3;
  if ((ulong)uVar3 == 0) {
    this->Array = (FUDMFKey *)0x0;
  }
  else {
    pFVar6 = (FUDMFKey *)
             M_Malloc_Dbg((ulong)uVar3 << 5,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                          ,0x199);
    this->Array = pFVar6;
    if (this->Count != 0) {
      lVar8 = 0x18;
      uVar7 = 0;
      do {
        pFVar6 = this->Array;
        pFVar4 = other->Array;
        *(undefined4 *)((long)pFVar6 + lVar8 + -0x18) =
             *(undefined4 *)((long)pFVar4 + lVar8 + -0x18);
        puVar1 = (undefined8 *)((long)pFVar4 + lVar8 + -0x14);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pFVar6 + lVar8 + -0x14);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        *(undefined4 *)((long)pFVar6 + lVar8 + -4) = *(undefined4 *)((long)pFVar4 + lVar8 + -4);
        FString::AttachToOther
                  ((FString *)((long)&(pFVar6->Key).Index + lVar8),
                   (FString *)((long)&(pFVar4->Key).Index + lVar8));
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x20;
      } while (uVar7 < this->Count);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}